

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall
soul::HEARTGenerator::initialiseArrayOrStructElements
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> list,Context *errorLocation)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t numberAvailable;
  undefined4 extraout_var_00;
  Expression *pEVar4;
  pool_ref<soul::AST::Expression> *this_00;
  Constant *pCVar5;
  undefined4 extraout_var_01;
  Structure *this_01;
  string *psVar6;
  ArrayElement *local_e8;
  bool local_89;
  string local_88;
  int local_68;
  pool_ptr<soul::AST::Constant> local_58;
  pool_ptr<soul::AST::Constant> constElement;
  Expression *sourceValue;
  size_t i;
  bool isStruct;
  Type *targetType;
  Context *errorLocation_local;
  Expression *target_local;
  HEARTGenerator *this_local;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> list_local;
  
  list_local.s = list.e;
  this_local = (HEARTGenerator *)list.s;
  iVar3 = (*(target->super_Object)._vptr_Object[2])();
  bVar1 = Type::isFixedSizeAggregate((Type *)CONCAT44(extraout_var,iVar3));
  checkAssertion(bVar1,"targetType.isFixedSizeAggregate()","initialiseArrayOrStructElements",0x3f9);
  numberAvailable =
       ArrayView<soul::pool_ref<soul::AST::Expression>_>::size
                 ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
  SanityCheckPass::throwErrorIfWrongNumberOfElements
            (errorLocation,(Type *)CONCAT44(extraout_var,iVar3),numberAvailable);
  iVar3 = (*(target->super_Object)._vptr_Object[2])();
  bVar1 = Type::isStruct((Type *)CONCAT44(extraout_var_00,iVar3));
  BlockBuilder::addZeroAssignment(&(this->builder).super_BlockBuilder,target);
  sourceValue = (Expression *)0x0;
  do {
    pEVar4 = (Expression *)
             ArrayView<soul::pool_ref<soul::AST::Expression>_>::size
                       ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
    if (pEVar4 <= sourceValue) {
      return;
    }
    this_00 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::operator[]
                        ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local,
                         (size_t)sourceValue);
    constElement.object = (Constant *)pool_ref<soul::AST::Expression>::get(this_00);
    (*((constElement.object)->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[0xd]
    )(&local_58);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_58);
    if (bVar2) {
      pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_58);
      bVar2 = soul::Value::isZero(&pCVar5->value);
      if (!bVar2) goto LAB_0041a7df;
      local_68 = 4;
    }
    else {
LAB_0041a7df:
      local_68 = 0;
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_58);
    if (local_68 == 0) {
      if (!bVar1) {
        local_e8 = BlockBuilder::createFixedArrayElement
                             (&(this->builder).super_BlockBuilder,target,(size_t)sourceValue);
      }
      else {
        iVar3 = (*(target->super_Object)._vptr_Object[2])();
        this_01 = Type::getStructRef((Type *)CONCAT44(extraout_var_01,iVar3));
        psVar6 = Structure::getMemberName_abi_cxx11_(this_01,(size_t)sourceValue);
        std::__cxx11::string::string((string *)&local_88,(string *)psVar6);
        local_e8 = (ArrayElement *)
                   BlockBuilder::createStructElement
                             (&(this->builder).super_BlockBuilder,target,&local_88);
      }
      local_89 = bVar1;
      createAssignment(this,&local_e8->super_Expression,&(constElement.object)->super_Expression);
      if (local_89) {
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    sourceValue = (Expression *)
                  ((long)&(sourceValue->super_Statement).super_ASTObject._vptr_ASTObject + 1);
  } while( true );
}

Assistant:

void initialiseArrayOrStructElements (heart::Expression& target, ArrayView<pool_ref<AST::Expression>> list,
                                          const AST::Context& errorLocation)
    {
        const auto& targetType = target.getType();
        SOUL_ASSERT (targetType.isFixedSizeAggregate());
        SanityCheckPass::throwErrorIfWrongNumberOfElements (errorLocation, targetType, list.size());
        bool isStruct = target.getType().isStruct();

        builder.addZeroAssignment (target);

        for (size_t i = 0; i < list.size(); ++i)
        {
            auto& sourceValue = list[i].get();

            if (auto constElement = sourceValue.getAsConstant())
                if (constElement->value.isZero()) // no need to assign to elements which are zero
                    continue;

            createAssignment (isStruct ? (heart::Expression&) builder.createStructElement (target, target.getType().getStructRef().getMemberName (i))
                                       : (heart::Expression&) builder.createFixedArrayElement (target, i),
                              sourceValue);
        }
    }